

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char * __thiscall pugi::xml_parse_result::description(xml_parse_result *this)

{
  xml_parse_result *this_local;
  char *local_8;
  
  switch(this->status) {
  case status_ok:
    local_8 = "No error";
    break;
  case status_file_not_found:
    local_8 = "File was not found";
    break;
  case status_io_error:
    local_8 = "Error reading from file/stream";
    break;
  case status_out_of_memory:
    local_8 = "Could not allocate memory";
    break;
  case status_internal_error:
    local_8 = "Internal error occurred";
    break;
  case status_unrecognized_tag:
    local_8 = "Could not determine tag type";
    break;
  case status_bad_pi:
    local_8 = "Error parsing document declaration/processing instruction";
    break;
  case status_bad_comment:
    local_8 = "Error parsing comment";
    break;
  case status_bad_cdata:
    local_8 = "Error parsing CDATA section";
    break;
  case status_bad_doctype:
    local_8 = "Error parsing document type declaration";
    break;
  case status_bad_pcdata:
    local_8 = "Error parsing PCDATA section";
    break;
  case status_bad_start_element:
    local_8 = "Error parsing start element tag";
    break;
  case status_bad_attribute:
    local_8 = "Error parsing element attribute";
    break;
  case status_bad_end_element:
    local_8 = "Error parsing end element tag";
    break;
  case status_end_element_mismatch:
    local_8 = "Start-end tags mismatch";
    break;
  case status_append_invalid_root:
    local_8 = "Unable to append nodes: root is not an element or document";
    break;
  case status_no_document_element:
    local_8 = "No document element found";
    break;
  default:
    local_8 = "Unknown error";
  }
  return local_8;
}

Assistant:

PUGI_IMPL_FN const char* xml_parse_result::description() const
	{
		switch (status)
		{
		case status_ok: return "No error";

		case status_file_not_found: return "File was not found";
		case status_io_error: return "Error reading from file/stream";
		case status_out_of_memory: return "Could not allocate memory";
		case status_internal_error: return "Internal error occurred";

		case status_unrecognized_tag: return "Could not determine tag type";

		case status_bad_pi: return "Error parsing document declaration/processing instruction";
		case status_bad_comment: return "Error parsing comment";
		case status_bad_cdata: return "Error parsing CDATA section";
		case status_bad_doctype: return "Error parsing document type declaration";
		case status_bad_pcdata: return "Error parsing PCDATA section";
		case status_bad_start_element: return "Error parsing start element tag";
		case status_bad_attribute: return "Error parsing element attribute";
		case status_bad_end_element: return "Error parsing end element tag";
		case status_end_element_mismatch: return "Start-end tags mismatch";

		case status_append_invalid_root: return "Unable to append nodes: root is not an element or document";

		case status_no_document_element: return "No document element found";

		default: return "Unknown error";
		}
	}